

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::
Inline_Map_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Inline_Map_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss)

{
  long lVar1;
  long *plVar2;
  Dispatch_Engine *this_00;
  long *plVar3;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  retval;
  undefined1 local_e0 [16];
  detail local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  File_Position local_90;
  File_Position local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_60;
  
  local_b0._24_8_ = (long)local_b0 + 8;
  local_b0._8_4_ = _S_red;
  local_b0._16_8_ = 0;
  local_88.line = 0;
  local_88.column = 0;
  lVar1 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
  plVar2 = *(long **)(lVar1 + 0x58);
  local_90 = (File_Position)local_b0._24_8_;
  for (plVar3 = *(long **)(lVar1 + 0x50); plVar3 != plVar2; plVar3 = plVar3 + 1) {
    this_00 = (in_RDX->m_engine)._M_data;
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               local_c0,(Dispatch_State *)**(undefined8 **)(*plVar3 + 0x50));
    chaiscript::detail::Dispatch_Engine::boxed_cast<std::__cxx11::string>
              (&local_80,this_00,(Boxed_Value *)local_c0);
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               local_e0,*(Dispatch_State **)(*(long *)(*plVar3 + 0x50) + 8));
    detail::clone_if_necessary
              (local_d0,(Boxed_Value *)local_e0,(atomic_uint_fast32_t *)&t_ss[3].m_stack_holder,
               in_RDX);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_true>
              (&local_60,&local_80,(Boxed_Value *)local_d0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                *)local_b0,&local_60);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
    ::~pair(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  }
  chaiscript::detail::
  const_var_impl<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)this);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
               *)local_b0);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static bool has_this_capture(const std::vector<AST_Node_Impl_Ptr<T>> &t_children) noexcept {
        return std::any_of(std::begin(t_children), std::end(t_children), [](const auto &child) { return child->children[0]->text == "this"; });
      }